

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Node * __thiscall anon_unknown.dwarf_1b0fcc::Db::parseType(Db *this)

{
  char *pcVar1;
  Cache CVar2;
  char *pcVar3;
  Node *pNVar4;
  char *pcVar5;
  ArrayType *pAVar6;
  NameType *pNVar7;
  ArrayType *pAVar8;
  Node *pNVar9;
  ulong uVar10;
  undefined **ppuVar11;
  char cVar12;
  uint uVar13;
  char (*args) [4];
  ulong uVar14;
  bool bVar15;
  Node NVar16;
  Node *Result;
  Node *Ty;
  StringView Dimension;
  ArrayType *local_40;
  Node *local_38;
  StringView local_30;
  
  local_40 = (ArrayType *)0x0;
  if (this->TypeCallback != (_func_void_void_ptr_char_ptr *)0x0) {
    (*this->TypeCallback)(this->TypeCallbackContext,this->First);
  }
  pcVar5 = this->First;
  pcVar3 = this->Last;
  uVar10 = (long)pcVar3 - (long)pcVar5;
  if (pcVar3 == pcVar5) {
    cVar12 = '\0';
  }
  else {
    cVar12 = *pcVar5;
  }
  switch(cVar12) {
  case 'A':
    if ((pcVar5 != pcVar3) && (*pcVar5 == 'A')) {
      pcVar1 = pcVar5 + 1;
      this->First = pcVar1;
      if ((pcVar3 == pcVar1) || (9 < (int)*pcVar1 - 0x30U)) {
        if ((pcVar1 == pcVar3) || (*pcVar1 != '_')) {
          pNVar4 = parseExpr(this);
          if ((pNVar4 != (Node *)0x0) &&
             ((pcVar5 = this->First, pcVar5 != this->Last && (*pcVar5 == '_')))) {
            this->First = pcVar5 + 1;
            pNVar9 = parseType(this);
            if (pNVar9 != (Node *)0x0) {
              pAVar8 = (ArrayType *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
              (pAVar8->super_Node).K = KArrayType;
              (pAVar8->super_Node).RHSComponentCache = Yes;
              (pAVar8->super_Node).ArrayCache = Yes;
              (pAVar8->super_Node).FunctionCache = No;
              (pAVar8->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018db18;
              pAVar8->Base = pNVar9;
              (pAVar8->Dimension).First = pNVar4;
              (pAVar8->Dimension).Second = (void *)0x0;
              break;
            }
          }
        }
        else {
          this->First = pcVar5 + 2;
          pNVar4 = parseType(this);
          if (pNVar4 != (Node *)0x0) {
            pAVar8 = (ArrayType *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
            (pAVar8->super_Node).K = KArrayType;
            (pAVar8->super_Node).RHSComponentCache = Yes;
            (pAVar8->super_Node).ArrayCache = Yes;
            (pAVar8->super_Node).FunctionCache = No;
            (pAVar8->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018db18;
            pAVar8->Base = pNVar4;
            (pAVar8->Dimension).First = (void *)0x0;
            (pAVar8->Dimension).Second = (void *)0x0;
            break;
          }
        }
      }
      else {
        local_30 = parseNumber(this,false);
        pcVar5 = this->First;
        pAVar8 = (ArrayType *)0x0;
        if (pcVar5 == this->Last) break;
        if (*pcVar5 == '_') {
          this->First = pcVar5 + 1;
          local_38 = parseType(this);
          if (local_38 != (Node *)0x0) {
            pAVar8 = (anonymous_namespace)::Db::
                     make<(anonymous_namespace)::ArrayType,(anonymous_namespace)::Node*&,StringView&>
                               ((Db *)this,&local_38,&local_30);
            break;
          }
        }
      }
    }
    pAVar8 = (ArrayType *)0x0;
    break;
  default:
    goto switchD_00155ed9_caseD_42;
  case 'C':
    this->First = pcVar5 + 1;
    pNVar4 = parseType(this);
    if (pNVar4 == (Node *)0x0) {
      return (Node *)0x0;
    }
    pAVar8 = (ArrayType *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
    (pAVar8->super_Node).K = KPostfixQualifiedType;
    (pAVar8->super_Node).RHSComponentCache = No;
    (pAVar8->super_Node).ArrayCache = No;
    (pAVar8->super_Node).FunctionCache = No;
    (pAVar8->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018dcd0;
    pAVar8->Base = pNVar4;
    (pAVar8->Dimension).First = " complex";
    pcVar5 = "";
    goto LAB_0015632b;
  case 'D':
    if (uVar10 < 2) {
      cVar12 = '\0';
    }
    else {
      cVar12 = pcVar5[1];
    }
    pAVar8 = local_40;
    switch(cVar12) {
    case 'O':
    case 'o':
    case 'w':
    case 'x':
      goto switchD_00155ed9_caseD_46;
    case 'T':
    case 't':
      pAVar8 = (ArrayType *)parseDecltype(this);
      break;
    case 'a':
      this->First = pcVar5 + 2;
      pcVar5 = "auto";
      goto LAB_001565ce;
    case 'c':
      this->First = pcVar5 + 2;
      pcVar5 = "decltype(auto)";
      goto LAB_001564e6;
    case 'd':
      this->First = pcVar5 + 2;
      pcVar5 = "decimal64";
      goto LAB_0015658e;
    case 'e':
      this->First = pcVar5 + 2;
      pcVar5 = "decimal128";
      goto LAB_0015618c;
    case 'f':
      this->First = pcVar5 + 2;
      pcVar5 = "decimal32";
      goto LAB_0015658e;
    case 'h':
      this->First = pcVar5 + 2;
      pcVar5 = "decimal16";
LAB_0015658e:
      pNVar7 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[10]>
                         ((Db *)this,(char (*) [10])pcVar5);
      return &pNVar7->super_Node;
    case 'i':
      this->First = pcVar5 + 2;
      pcVar5 = "char32_t";
      goto LAB_00155ff7;
    case 'n':
      this->First = pcVar5 + 2;
      pcVar5 = "std::nullptr_t";
LAB_001564e6:
      pNVar7 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[15]>
                         ((Db *)this,(char (*) [15])pcVar5);
      return &pNVar7->super_Node;
    case 'p':
      this->First = pcVar5 + 2;
      pNVar4 = parseType(this);
      if (pNVar4 == (Node *)0x0) {
        return (Node *)0x0;
      }
      pAVar8 = (ArrayType *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
      (pAVar8->super_Node).K = KParameterPackExpansion;
      (pAVar8->super_Node).RHSComponentCache = No;
      (pAVar8->super_Node).ArrayCache = No;
      (pAVar8->super_Node).FunctionCache = No;
      ppuVar11 = &PTR_hasRHSComponentSlow_0018caf0;
      goto LAB_00156575;
    case 's':
      this->First = pcVar5 + 2;
      pcVar5 = "char16_t";
LAB_00155ff7:
      pNVar7 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[9]>
                         ((Db *)this,(char (*) [9])pcVar5);
      return &pNVar7->super_Node;
    case 'v':
      pAVar8 = (ArrayType *)parseVectorType(this);
    }
    break;
  case 'F':
    goto switchD_00155ed9_caseD_46;
  case 'G':
    this->First = pcVar5 + 1;
    pNVar4 = parseType(this);
    if (pNVar4 == (Node *)0x0) {
      return (Node *)0x0;
    }
    pAVar8 = (ArrayType *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
    (pAVar8->super_Node).K = KPostfixQualifiedType;
    (pAVar8->super_Node).RHSComponentCache = No;
    (pAVar8->super_Node).ArrayCache = No;
    (pAVar8->super_Node).FunctionCache = No;
    (pAVar8->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018dcd0;
    pAVar8->Base = pNVar4;
    (pAVar8->Dimension).First = " imaginary";
    pcVar5 = "";
LAB_0015632b:
    (pAVar8->Dimension).Second = pcVar5;
    break;
  case 'K':
  case 'V':
  case 'r':
    uVar13 = 0;
    uVar14 = 0;
    if (pcVar3 != pcVar5) {
      uVar14 = (ulong)(*pcVar5 == 'r');
    }
    if (uVar14 < uVar10) {
      uVar13 = (uint)(pcVar5[uVar14] == 'V');
    }
    uVar14 = uVar13 + uVar14;
    uVar13 = 0;
    if (uVar14 < uVar10) {
      uVar13 = (uint)(pcVar5[uVar14] == 'K');
    }
    uVar14 = uVar13 + uVar14;
    if ((uVar10 <= uVar14) ||
       ((pcVar5[uVar14] != 'F' &&
        ((((uVar10 <= uVar14 || (pcVar5[uVar14] != 'D')) || (uVar14 = uVar14 + 1, uVar10 <= uVar14))
         || ((pcVar5[uVar14] != 'o' &&
             ((uVar10 <= uVar14 ||
              ((pcVar5[uVar14] != 'O' &&
               ((uVar10 <= uVar14 ||
                ((pcVar5[uVar14] != 'w' && ((uVar10 <= uVar14 || (pcVar5[uVar14] != 'x')))))))))))))
         ))))) goto switchD_00155ed9_caseD_55;
    goto switchD_00155ed9_caseD_46;
  case 'M':
    if ((pcVar5 != pcVar3) && (*pcVar5 == 'M')) {
      this->First = pcVar5 + 1;
      pNVar4 = parseType(this);
      if ((pNVar4 != (Node *)0x0) && (pNVar9 = parseType(this), pNVar9 != (Node *)0x0)) {
        pAVar8 = (ArrayType *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
        CVar2 = pNVar9->RHSComponentCache;
        (pAVar8->super_Node).K = KPointerToMemberType;
        (pAVar8->super_Node).RHSComponentCache = CVar2;
        (pAVar8->super_Node).ArrayCache = No;
        (pAVar8->super_Node).FunctionCache = No;
        (pAVar8->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018db70;
        pAVar8->Base = pNVar4;
        (pAVar8->Dimension).First = pNVar9;
        break;
      }
    }
    pAVar8 = (ArrayType *)0x0;
    break;
  case 'O':
    this->First = pcVar5 + 1;
    local_30.First = (char *)parseType(this);
    if ((Node *)local_30.First == (Node *)0x0) {
      return (Node *)0x0;
    }
    local_38 = (Node *)CONCAT44(local_38._4_4_,1);
    goto LAB_00156520;
  case 'P':
    this->First = pcVar5 + 1;
    pNVar4 = parseType(this);
    if (pNVar4 == (Node *)0x0) {
      return (Node *)0x0;
    }
    pAVar8 = (ArrayType *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
    CVar2 = pNVar4->RHSComponentCache;
    (pAVar8->super_Node).K = KPointerType;
    (pAVar8->super_Node).RHSComponentCache = CVar2;
    (pAVar8->super_Node).ArrayCache = No;
    (pAVar8->super_Node).FunctionCache = No;
    ppuVar11 = &PTR_hasRHSComponentSlow_0018dc20;
LAB_00156575:
    (pAVar8->super_Node)._vptr_Node = (_func_int **)ppuVar11;
    pAVar8->Base = pNVar4;
    break;
  case 'R':
    this->First = pcVar5 + 1;
    local_30.First = (char *)parseType(this);
    if ((Node *)local_30.First == (Node *)0x0) {
      return (Node *)0x0;
    }
    local_38 = (Node *)((ulong)local_38 & 0xffffffff00000000);
LAB_00156520:
    pAVar8 = (ArrayType *)
             (anonymous_namespace)::Db::
             make<(anonymous_namespace)::ReferenceType,(anonymous_namespace)::Node*&,(anonymous_namespace)::ReferenceKind>
                       ((Db *)this,(Node **)&local_30,(ReferenceKind *)&local_38);
    break;
  case 'S':
    if (((1 < uVar10) && (pcVar5[1] != '\0')) && ((uVar10 < 2 || (pcVar5[1] != 't')))) {
      pNVar4 = parseSubstitution(this);
      if (pNVar4 == (Node *)0x0) {
        pNVar4 = (Node *)0x0;
LAB_0015679a:
        bVar15 = false;
      }
      else {
        if (((this->TryToParseTemplateArgs != true) || (this->Last == this->First)) ||
           (*this->First != 'I')) goto LAB_0015679a;
        pNVar9 = parseTemplateArgs(this,false);
        bVar15 = pNVar9 != (Node *)0x0;
        if (bVar15) {
          local_40 = (ArrayType *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
          (local_40->super_Node).K = KNameWithTemplateArgs;
          (local_40->super_Node).RHSComponentCache = No;
          (local_40->super_Node).ArrayCache = No;
          (local_40->super_Node).FunctionCache = No;
          (local_40->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018d6a0;
          local_40->Base = pNVar4;
          (local_40->Dimension).First = pNVar9;
        }
        pNVar4 = (Node *)0x0;
      }
      pAVar8 = local_40;
      if (!bVar15) {
        return pNVar4;
      }
      break;
    }
    goto switchD_00155ed9_caseD_42;
  case 'T':
    if ((uVar10 < 2) ||
       ((pcVar5[1] != 's' &&
        ((uVar10 < 2 || ((pcVar5[1] != 'u' && ((uVar10 < 2 || (pcVar5[1] != 'e')))))))))) {
      pAVar8 = (ArrayType *)parseTemplateParam(this);
      if (pAVar8 == (ArrayType *)0x0) {
        return (Node *)0x0;
      }
      if (((this->TryToParseTemplateArgs == true) && (this->Last != this->First)) &&
         (*this->First == 'I')) {
        local_40 = pAVar8;
        pNVar4 = parseTemplateArgs(this,false);
        if (pNVar4 == (Node *)0x0) {
          return (Node *)0x0;
        }
        pAVar6 = (ArrayType *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
        (pAVar6->super_Node).K = KNameWithTemplateArgs;
        (pAVar6->super_Node).RHSComponentCache = No;
        (pAVar6->super_Node).ArrayCache = No;
        (pAVar6->super_Node).FunctionCache = No;
        (pAVar6->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018d6a0;
        pAVar6->Base = (Node *)pAVar8;
        (pAVar6->Dimension).First = pNVar4;
        pAVar8 = pAVar6;
      }
      break;
    }
switchD_00155ed9_caseD_42:
    pAVar8 = (ArrayType *)parseClassEnumType(this);
    break;
  case 'U':
switchD_00155ed9_caseD_55:
    pAVar8 = (ArrayType *)parseQualifiedType(this);
    break;
  case 'a':
    this->First = pcVar5 + 1;
    pcVar5 = "signed char";
    goto LAB_001565ae;
  case 'b':
    this->First = pcVar5 + 1;
    pcVar5 = "bool";
    goto LAB_001565ce;
  case 'c':
    this->First = pcVar5 + 1;
    pcVar5 = "char";
    goto LAB_001565ce;
  case 'd':
    this->First = pcVar5 + 1;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KNameType;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018c728;
    pNVar4[1]._vptr_Node = (_func_int **)0x170e29;
    pcVar5 = "";
    goto LAB_00156176;
  case 'e':
    this->First = pcVar5 + 1;
    pcVar5 = "long double";
LAB_001565ae:
    pNVar7 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[12]>
                       ((Db *)this,(char (*) [12])pcVar5);
    return &pNVar7->super_Node;
  case 'f':
    this->First = pcVar5 + 1;
    pcVar5 = "float";
    goto LAB_001563ba;
  case 'g':
    this->First = pcVar5 + 1;
    pcVar5 = "__float128";
LAB_0015618c:
    pNVar7 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[11]>
                       ((Db *)this,(char (*) [11])pcVar5);
    return &pNVar7->super_Node;
  case 'h':
    this->First = pcVar5 + 1;
    pcVar5 = "unsigned char";
    goto LAB_0015646b;
  case 'i':
    this->First = pcVar5 + 1;
    args = (char (*) [4])0x170df9;
    goto LAB_00156272;
  case 'j':
    this->First = pcVar5 + 1;
    pNVar7 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[13]>
                       ((Db *)this,(char (*) [13])"unsigned int");
    return &pNVar7->super_Node;
  case 'l':
    this->First = pcVar5 + 1;
    pcVar5 = "long";
    goto LAB_001565ce;
  case 'm':
    this->First = pcVar5 + 1;
    pcVar5 = "unsigned long";
LAB_0015646b:
    pNVar7 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[14]>
                       ((Db *)this,(char (*) [14])pcVar5);
    return &pNVar7->super_Node;
  case 'n':
    this->First = pcVar5 + 1;
    pcVar5 = "__int128";
    goto LAB_00155ff7;
  case 'o':
    this->First = pcVar5 + 1;
    pNVar7 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[18]>
                       ((Db *)this,(char (*) [18])"unsigned __int128");
    return &pNVar7->super_Node;
  case 's':
    this->First = pcVar5 + 1;
    pcVar5 = "short";
LAB_001563ba:
    pNVar7 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[6]>
                       ((Db *)this,(char (*) [6])pcVar5);
    return &pNVar7->super_Node;
  case 't':
    this->First = pcVar5 + 1;
    pcVar5 = "unsigned short";
    goto LAB_001564e6;
  case 'u':
    this->First = pcVar5 + 1;
    NVar16 = (Node)parseBareSourceName(this);
    if (NVar16._vptr_Node == NVar16._8_8_) {
      return (Node *)0x0;
    }
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KNameType;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018c728;
    pNVar4[1] = NVar16;
    return pNVar4;
  case 'v':
    this->First = pcVar5 + 1;
    pcVar5 = "void";
LAB_001565ce:
    pNVar7 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[5]>
                       ((Db *)this,(char (*) [5])pcVar5);
    return &pNVar7->super_Node;
  case 'w':
    this->First = pcVar5 + 1;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KNameType;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018c728;
    pNVar4[1]._vptr_Node = (_func_int **)"wchar_t";
    pcVar5 = "";
    goto LAB_00156176;
  case 'x':
    this->First = pcVar5 + 1;
    pcVar5 = "long long";
    goto LAB_0015658e;
  case 'y':
    this->First = pcVar5 + 1;
    pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar4->K = KNameType;
    pNVar4->RHSComponentCache = No;
    pNVar4->ArrayCache = No;
    pNVar4->FunctionCache = No;
    pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018c728;
    pNVar4[1]._vptr_Node = (_func_int **)"unsigned long long";
    pcVar5 = "";
LAB_00156176:
    *(char **)&pNVar4[1].K = pcVar5;
    return pNVar4;
  case 'z':
    this->First = pcVar5 + 1;
    args = (char (*) [4])0x1616e5;
LAB_00156272:
    pNVar7 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[4]>
                       ((Db *)this,args);
    return &pNVar7->super_Node;
  }
switchD_00156600_caseD_50:
  local_40 = pAVar8;
  pAVar8 = local_40;
  if (local_40 != (ArrayType *)0x0) {
    PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Subs,(Node **)&local_40);
  }
  return &pAVar8->super_Node;
switchD_00155ed9_caseD_46:
  pAVar8 = (ArrayType *)parseFunctionType(this);
  goto switchD_00156600_caseD_50;
}

Assistant:

Node *Db::parseType() {
  Node *Result = nullptr;

  if (TypeCallback != nullptr)
    TypeCallback(TypeCallbackContext, First);

  switch (look()) {
  //             ::= <qualified-type>
  case 'r':
  case 'V':
  case 'K': {
    unsigned AfterQuals = 0;
    if (look(AfterQuals) == 'r') ++AfterQuals;
    if (look(AfterQuals) == 'V') ++AfterQuals;
    if (look(AfterQuals) == 'K') ++AfterQuals;

    if (look(AfterQuals) == 'F' ||
        (look(AfterQuals) == 'D' &&
         (look(AfterQuals + 1) == 'o' || look(AfterQuals + 1) == 'O' ||
          look(AfterQuals + 1) == 'w' || look(AfterQuals + 1) == 'x'))) {
      Result = parseFunctionType();
      break;
    }
    LLVM_FALLTHROUGH;
  }
  case 'U': {
    Result = parseQualifiedType();
    break;
  }
  // <builtin-type> ::= v    # void
  case 'v':
    ++First;
    return make<NameType>("void");
  //                ::= w    # wchar_t
  case 'w':
    ++First;
    return make<NameType>("wchar_t");
  //                ::= b    # bool
  case 'b':
    ++First;
    return make<NameType>("bool");
  //                ::= c    # char
  case 'c':
    ++First;
    return make<NameType>("char");
  //                ::= a    # signed char
  case 'a':
    ++First;
    return make<NameType>("signed char");
  //                ::= h    # unsigned char
  case 'h':
    ++First;
    return make<NameType>("unsigned char");
  //                ::= s    # short
  case 's':
    ++First;
    return make<NameType>("short");
  //                ::= t    # unsigned short
  case 't':
    ++First;
    return make<NameType>("unsigned short");
  //                ::= i    # int
  case 'i':
    ++First;
    return make<NameType>("int");
  //                ::= j    # unsigned int
  case 'j':
    ++First;
    return make<NameType>("unsigned int");
  //                ::= l    # long
  case 'l':
    ++First;
    return make<NameType>("long");
  //                ::= m    # unsigned long
  case 'm':
    ++First;
    return make<NameType>("unsigned long");
  //                ::= x    # long long, __int64
  case 'x':
    ++First;
    return make<NameType>("long long");
  //                ::= y    # unsigned long long, __int64
  case 'y':
    ++First;
    return make<NameType>("unsigned long long");
  //                ::= n    # __int128
  case 'n':
    ++First;
    return make<NameType>("__int128");
  //                ::= o    # unsigned __int128
  case 'o':
    ++First;
    return make<NameType>("unsigned __int128");
  //                ::= f    # float
  case 'f':
    ++First;
    return make<NameType>("float");
  //                ::= d    # double
  case 'd':
    ++First;
    return make<NameType>("double");
  //                ::= e    # long double, __float80
  case 'e':
    ++First;
    return make<NameType>("long double");
  //                ::= g    # __float128
  case 'g':
    ++First;
    return make<NameType>("__float128");
  //                ::= z    # ellipsis
  case 'z':
    ++First;
    return make<NameType>("...");

  // <builtin-type> ::= u <source-name>    # vendor extended type
  case 'u': {
    ++First;
    StringView Res = parseBareSourceName();
    if (Res.empty())
      return nullptr;
    return make<NameType>(Res);
  }
  case 'D':
    switch (look(1)) {
    //                ::= Dd   # IEEE 754r decimal floating point (64 bits)
    case 'd':
      First += 2;
      return make<NameType>("decimal64");
    //                ::= De   # IEEE 754r decimal floating point (128 bits)
    case 'e':
      First += 2;
      return make<NameType>("decimal128");
    //                ::= Df   # IEEE 754r decimal floating point (32 bits)
    case 'f':
      First += 2;
      return make<NameType>("decimal32");
    //                ::= Dh   # IEEE 754r half-precision floating point (16 bits)
    case 'h':
      First += 2;
      return make<NameType>("decimal16");
    //                ::= Di   # char32_t
    case 'i':
      First += 2;
      return make<NameType>("char32_t");
    //                ::= Ds   # char16_t
    case 's':
      First += 2;
      return make<NameType>("char16_t");
    //                ::= Da   # auto (in dependent new-expressions)
    case 'a':
      First += 2;
      return make<NameType>("auto");
    //                ::= Dc   # decltype(auto)
    case 'c':
      First += 2;
      return make<NameType>("decltype(auto)");
    //                ::= Dn   # std::nullptr_t (i.e., decltype(nullptr))
    case 'n':
      First += 2;
      return make<NameType>("std::nullptr_t");

    //             ::= <decltype>
    case 't':
    case 'T': {
      Result = parseDecltype();
      break;
    }
    // extension   ::= <vector-type> # <vector-type> starts with Dv
    case 'v': {
      Result = parseVectorType();
      break;
    }
    //           ::= Dp <type>       # pack expansion (C++0x)
    case 'p': {
      First += 2;
      Node *Child = parseType();
      if (!Child)
        return nullptr;
      Result = make<ParameterPackExpansion>(Child);
      break;
    }
    // Exception specifier on a function type.
    case 'o':
    case 'O':
    case 'w':
    // Transaction safe function type.
    case 'x':
      Result = parseFunctionType();
      break;
    }
    break;
  //             ::= <function-type>
  case 'F': {
    Result = parseFunctionType();
    break;
  }
  //             ::= <array-type>
  case 'A': {
    Result = parseArrayType();
    break;
  }
  //             ::= <pointer-to-member-type>
  case 'M': {
    Result = parsePointerToMemberType();
    break;
  }
  //             ::= <template-param>
  case 'T': {
    // This could be an elaborate type specifier on a <class-enum-type>.
    if (look(1) == 's' || look(1) == 'u' || look(1) == 'e') {
      Result = parseClassEnumType();
      break;
    }

    Result = parseTemplateParam();
    if (Result == nullptr)
      return nullptr;

    // Result could be either of:
    //   <type>        ::= <template-param>
    //   <type>        ::= <template-template-param> <template-args>
    //
    //   <template-template-param> ::= <template-param>
    //                             ::= <substitution>
    //
    // If this is followed by some <template-args>, and we're permitted to
    // parse them, take the second production.

    if (TryToParseTemplateArgs && look() == 'I') {
      Node *TA = parseTemplateArgs();
      if (TA == nullptr)
        return nullptr;
      Result = make<NameWithTemplateArgs>(Result, TA);
    }
    break;
  }
  //             ::= P <type>        # pointer
  case 'P': {
    ++First;
    Node *Ptr = parseType();
    if (Ptr == nullptr)
      return nullptr;
    Result = make<PointerType>(Ptr);
    break;
  }
  //             ::= R <type>        # l-value reference
  case 'R': {
    ++First;
    Node *Ref = parseType();
    if (Ref == nullptr)
      return nullptr;
    Result = make<ReferenceType>(Ref, ReferenceKind::LValue);
    break;
  }
  //             ::= O <type>        # r-value reference (C++11)
  case 'O': {
    ++First;
    Node *Ref = parseType();
    if (Ref == nullptr)
      return nullptr;
    Result = make<ReferenceType>(Ref, ReferenceKind::RValue);
    break;
  }
  //             ::= C <type>        # complex pair (C99)
  case 'C': {
    ++First;
    Node *P = parseType();
    if (P == nullptr)
      return nullptr;
    Result = make<PostfixQualifiedType>(P, " complex");
    break;
  }
  //             ::= G <type>        # imaginary (C99)
  case 'G': {
    ++First;
    Node *P = parseType();
    if (P == nullptr)
      return P;
    Result = make<PostfixQualifiedType>(P, " imaginary");
    break;
  }
  //             ::= <substitution>  # See Compression below
  case 'S': {
    if (look(1) && look(1) != 't') {
      Node *Sub = parseSubstitution();
      if (Sub == nullptr)
        return nullptr;

      // Sub could be either of:
      //   <type>        ::= <substitution>
      //   <type>        ::= <template-template-param> <template-args>
      //
      //   <template-template-param> ::= <template-param>
      //                             ::= <substitution>
      //
      // If this is followed by some <template-args>, and we're permitted to
      // parse them, take the second production.

      if (TryToParseTemplateArgs && look() == 'I') {
        Node *TA = parseTemplateArgs();
        if (TA == nullptr)
          return nullptr;
        Result = make<NameWithTemplateArgs>(Sub, TA);
        break;
      }

      // If all we parsed was a substitution, don't re-insert into the
      // substitution table.
      return Sub;
    }
    LLVM_FALLTHROUGH;
  }
  //        ::= <class-enum-type>
  default: {
    Result = parseClassEnumType();
    break;
  }
  }

  // If we parsed a type, insert it into the substitution table. Note that all
  // <builtin-type>s and <substitution>s have already bailed out, because they
  // don't get substitutions.
  if (Result != nullptr)
    Subs.push_back(Result);
  return Result;
}